

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::set_execution_mode
          (Compiler *this,ExecutionMode mode,uint32_t arg0,uint32_t arg1,uint32_t arg2)

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  ulong __code;
  __node_gen_type __node_gen;
  ExecutionMode local_34;
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_30;
  
  __code = (ulong)(this->ir).default_entry_point.id;
  p_Var2 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      __code % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,__code);
  p_Var1 = p_Var2->_M_nxt;
  if (mode < 0x40) {
    p_Var1[0x12]._M_nxt =
         (_Hash_node_base *)((ulong)p_Var1[0x12]._M_nxt | 1L << ((byte)mode & 0x3f));
  }
  else {
    local_30 = (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)(p_Var1 + 0x13);
    local_34 = mode;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              (local_30,&local_34);
  }
  if ((int)mode < 0x1a) {
    if (mode == ExecutionModeInvocations) {
      *(uint32_t *)((long)&p_Var1[0x1d]._M_nxt + 4) = arg0;
    }
    else if (mode == ExecutionModeLocalSize) {
      *(uint32_t *)&p_Var1[0x1a]._M_nxt = arg0;
      *(uint32_t *)((long)&p_Var1[0x1a]._M_nxt + 4) = arg1;
      *(uint32_t *)&p_Var1[0x1b]._M_nxt = arg2;
    }
  }
  else if (mode == ExecutionModeOutputVertices) {
    *(uint32_t *)&p_Var1[0x1e]._M_nxt = arg0;
  }
  else if (mode == ExecutionModeLocalSizeId) {
    *(uint32_t *)((long)&p_Var1[0x1b]._M_nxt + 4) = arg0;
    *(uint32_t *)&p_Var1[0x1c]._M_nxt = arg1;
    *(uint32_t *)((long)&p_Var1[0x1c]._M_nxt + 4) = arg2;
  }
  else if (mode == ExecutionModeOutputPrimitivesEXT) {
    *(uint32_t *)((long)&p_Var1[0x1e]._M_nxt + 4) = arg0;
  }
  return;
}

Assistant:

void Compiler::set_execution_mode(ExecutionMode mode, uint32_t arg0, uint32_t arg1, uint32_t arg2)
{
	auto &execution = get_entry_point();

	execution.flags.set(mode);
	switch (mode)
	{
	case ExecutionModeLocalSize:
		execution.workgroup_size.x = arg0;
		execution.workgroup_size.y = arg1;
		execution.workgroup_size.z = arg2;
		break;

	case ExecutionModeLocalSizeId:
		execution.workgroup_size.id_x = arg0;
		execution.workgroup_size.id_y = arg1;
		execution.workgroup_size.id_z = arg2;
		break;

	case ExecutionModeInvocations:
		execution.invocations = arg0;
		break;

	case ExecutionModeOutputVertices:
		execution.output_vertices = arg0;
		break;

	case ExecutionModeOutputPrimitivesEXT:
		execution.output_primitives = arg0;
		break;

	default:
		break;
	}
}